

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O1

int __thiscall ON_Matrix::RowReduce(ON_Matrix *this,double zero_tolerance,double *B,double *pivot)

{
  ulong uVar1;
  double **ppdVar2;
  double *pdVar3;
  double ***pppdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int row0;
  double dVar11;
  double dVar12;
  double local_78;
  
  uVar9 = this->m_row_count;
  pppdVar4 = &this->m;
  if (uVar9 == (this->m_rowmem).m_count) {
    pppdVar4 = &(this->m_rowmem).m_a;
  }
  uVar8 = this->m_col_count;
  if ((int)uVar9 < this->m_col_count) {
    uVar8 = uVar9;
  }
  if ((int)uVar8 < 1) {
    dVar12 = 0.0;
    uVar9 = 0;
  }
  else {
    ppdVar2 = *pppdVar4;
    local_78 = 0.0;
    uVar7 = 1;
    uVar10 = 0;
    do {
      dVar11 = ABS(ppdVar2[uVar10][uVar10]);
      uVar1 = uVar10 + 1;
      uVar9 = (uint)uVar10;
      if ((long)uVar1 < (long)this->m_row_count) {
        uVar6 = uVar10 & 0xffffffff;
        uVar5 = uVar7;
        do {
          if (dVar11 < ABS(ppdVar2[uVar5][uVar10])) {
            uVar6 = uVar5 & 0xffffffff;
            dVar11 = ABS(ppdVar2[uVar5][uVar10]);
          }
          uVar5 = uVar5 + 1;
        } while ((uint)this->m_row_count != uVar5);
      }
      else {
        uVar6 = uVar10 & 0xffffffff;
      }
      dVar12 = dVar11;
      if ((uVar10 != 0) && (local_78 <= dVar11)) {
        dVar12 = local_78;
      }
      if (dVar11 <= zero_tolerance) break;
      row0 = (int)uVar6;
      if (uVar10 != uVar6) {
        SwapRows(this,row0,uVar9);
        dVar11 = B[row0];
        B[row0] = B[uVar10];
        B[uVar10] = dVar11;
      }
      pdVar3 = ppdVar2[uVar10];
      dVar11 = pdVar3[uVar10];
      pdVar3[uVar10] = 1.0;
      ON_ArrayScale(this->m_col_count + ~uVar9,1.0 / dVar11,pdVar3 + uVar1,pdVar3 + uVar1);
      B[uVar10] = (1.0 / dVar11) * B[uVar10];
      uVar6 = uVar7;
      if ((long)uVar1 < (long)this->m_row_count) {
        do {
          pdVar3 = ppdVar2[uVar6];
          dVar11 = pdVar3[uVar10];
          pdVar3[uVar10] = 0.0;
          if (zero_tolerance < ABS(dVar11)) {
            ON_Array_aA_plus_B(this->m_col_count + ~uVar9,-dVar11,ppdVar2[uVar10] + uVar1,
                               pdVar3 + uVar1,pdVar3 + uVar1);
            B[uVar6] = B[uVar6] - dVar11 * B[uVar10];
          }
          uVar6 = uVar6 + 1;
        } while ((int)uVar6 < this->m_row_count);
      }
      uVar7 = uVar7 + 1;
      uVar10 = uVar1;
      uVar9 = uVar8;
      local_78 = dVar12;
    } while (uVar1 != uVar8);
  }
  if (pivot != (double *)0x0) {
    *pivot = dVar12;
  }
  return uVar9;
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    double* B,
    double* pivot 
    )
{
  double t;
  double x, piv;
  int i, k, ix, rank;

  double** this_m = ThisM();
  piv = 0.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance )
      break;
    rank++;

    if ( ix != k )
    {
      // swap rows of matrix and B
      SwapRows( ix, k );
      t = B[ix]; B[ix] = B[k]; B[k] = t;
    }

    // scale row k of matrix and B
    x = 1.0/this_m[k][k];
    this_m[k][k] = 1.0;
    ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );
    B[k] *= x;

    // zero column k for rows below this_m[k][k]
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
        B[i] += x*B[k];
      }
    }
  }

  if ( pivot )
    *pivot = piv;

  return rank;
}